

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O2

void __thiscall Fixture_ctr_strong_from_weak::testCase(Fixture_ctr_strong_from_weak *this)

{
  uint __line;
  int iVar1;
  char *__assertion;
  shared_ptr<TestSharedPtrObj> ptr;
  
  rcc::shared_ptr<TestSharedPtrObj>::shared_ptr(&ptr,&(this->super_Fixture).weak);
  iVar1 = IObjectSharedState::ObjectCount((this->super_Fixture).state);
  if (iVar1 == (this->super_Fixture).start_obj_count + 1) {
    iVar1 = IObjectSharedState::StateCount((this->super_Fixture).state);
    if (iVar1 == (this->super_Fixture).start_state_count + 1) {
      rcc::shared_ptr<TestSharedPtrObj>::~shared_ptr(&ptr);
      return;
    }
    __assertion = "state->StateCount() == start_state_count + 1";
    __line = 0x30;
  }
  else {
    __assertion = "state->ObjectCount() == start_obj_count + 1";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                ,__line,"void Fixture_ctr_strong_from_weak::testCase()");
}

Assistant:

TEST_CASE(ctr_strong_from_weak){
    rcc::shared_ptr<TestSharedPtrObj> ptr(weak);
    assert(state->ObjectCount() == start_obj_count + 1);
    assert(state->StateCount() == start_state_count + 1);
}